

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O0

FormattedNumber __thiscall
icu_63::number::LocalizedNumberFormatter::formatDecimal
          (LocalizedNumberFormatter *this,StringPiece value,UErrorCode *status)

{
  UBool UVar1;
  UFormattedNumberData *pUVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar3;
  LocalizedNumberFormatter *size;
  UErrorCode *in_R8;
  StringPiece n;
  FormattedNumber FVar4;
  UFormattedNumberData *local_88;
  UFormattedNumberData *results;
  UErrorCode *status_local;
  LocalizedNumberFormatter *this_local;
  StringPiece value_local;
  
  size = (LocalizedNumberFormatter *)value.ptr_;
  UVar1 = ::U_FAILURE(*in_R8);
  if (UVar1 == '\0') {
    pUVar2 = (UFormattedNumberData *)UMemory::operator_new((UMemory *)0x158,(size_t)size);
    local_88 = (UFormattedNumberData *)0x0;
    if (pUVar2 != (UFormattedNumberData *)0x0) {
      memset(pUVar2,0,0x158);
      impl::UFormattedNumberData::UFormattedNumberData(pUVar2);
      local_88 = pUVar2;
    }
    if (local_88 == (UFormattedNumberData *)0x0) {
      *in_R8 = U_MEMORY_ALLOCATION_ERROR;
      FormattedNumber::FormattedNumber((FormattedNumber *)this,*in_R8);
      uVar3 = extraout_RDX_00;
    }
    else {
      n.length_ = (int)status;
      n.ptr_ = (char *)value._8_8_;
      n._12_4_ = 0;
      impl::DecimalQuantity::setToDecNumber(&local_88->quantity,n,in_R8);
      pUVar2 = local_88;
      formatImpl((LocalizedNumberFormatter *)value.ptr_,local_88,in_R8);
      UVar1 = ::U_SUCCESS(*in_R8);
      if (UVar1 == '\0') {
        if (local_88 != (UFormattedNumberData *)0x0) {
          impl::UFormattedNumberData::~UFormattedNumberData(local_88);
          UMemory::operator_delete((UMemory *)local_88,pUVar2);
        }
        FormattedNumber::FormattedNumber((FormattedNumber *)this,*in_R8);
        uVar3 = extraout_RDX_02;
      }
      else {
        FormattedNumber::FormattedNumber((FormattedNumber *)this,local_88);
        uVar3 = extraout_RDX_01;
      }
    }
  }
  else {
    FormattedNumber::FormattedNumber((FormattedNumber *)this,U_ILLEGAL_ARGUMENT_ERROR);
    uVar3 = extraout_RDX;
  }
  FVar4._8_8_ = uVar3;
  FVar4.fResults = (UFormattedNumberData *)this;
  return FVar4;
}

Assistant:

FormattedNumber LocalizedNumberFormatter::formatDecimal(StringPiece value, UErrorCode& status) const {
    if (U_FAILURE(status)) { return FormattedNumber(U_ILLEGAL_ARGUMENT_ERROR); }
    auto results = new UFormattedNumberData();
    if (results == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return FormattedNumber(status);
    }
    results->quantity.setToDecNumber(value, status);
    formatImpl(results, status);

    // Do not save the results object if we encountered a failure.
    if (U_SUCCESS(status)) {
        return FormattedNumber(results);
    } else {
        delete results;
        return FormattedNumber(status);
    }
}